

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

void __thiscall
tyti::stl::
stl_parser_binary<double,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::stl_parser_binary(stl_parser_binary<double,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  expr_param pbVar1;
  actor<boost::spirit::argument<0>_> *paVar2;
  proto_child0 a1;
  actor<boost::spirit::attribute<0>_> *tuple;
  actor<boost::spirit::attribute<0>_> *tuple_00;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0;
  actor<boost::spirit::attribute<0>_> *tuple_01;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_00;
  actor<boost::spirit::attribute<0>_> *tuple_02;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_01;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_02;
  actor<boost::spirit::attribute<0>_> *tuple_03;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_03;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<3>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>
  *a0_04;
  phoenix *ppVar3;
  expr_param e;
  expr_param e_00;
  undefined4 local_d26;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_d20;
  undefined1 local_d06 [6];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_d00;
  proto_child0 local_cf8;
  undefined4 local_cec;
  terminal<boost::spirit::tag::repeat> local_ce8 [8];
  undefined4 *local_ce0;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_cd8;
  undefined1 local_cc6 [6];
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_cc0;
  proto_child0 local_cb8;
  proto_child0 local_cb0;
  undefined4 **local_ca8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  local_ca0;
  undefined1 local_c90 [16];
  undefined1 local_c80 [4];
  undefined4 local_c7c;
  uint local_c78 [2];
  undefined1 local_c6e [20];
  type local_c5a [3];
  expr_type local_c4c;
  undefined8 local_c44;
  actor<_f9bcd16b_> that_13;
  terminal<boost::spirit::tag::byte_> local_c13 [3];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  local_c10;
  undefined4 local_bfc;
  terminal<boost::spirit::tag::repeat> local_bf8 [8];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  local_bf0;
  expr<_eccd61ae_> local_be0;
  expr<_3f7532bb_> local_bd0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  local_bc0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  local_bb0;
  allocator<char> local_b99;
  string local_b98;
  allocator<char> local_b71;
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b11;
  string local_b10;
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_af0;
  stl_parser_binary<double,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  undefined1 *local_ae0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  *local_ad8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&,_const_boost::spirit::terminal<boost::spirit::tag::little_bin_float>_&>,_2L>
  *local_ad0;
  proto_child1 local_ac8;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  proto_child0 local_aa8;
  proto_child1 local_aa0;
  undefined1 *local_a90;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *local_a88;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *local_a80;
  undefined1 *local_a78;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_a70;
  actor<boost::spirit::argument<0>_> *local_a68;
  actor<boost::spirit::argument<0>_> *local_a60;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  that_5;
  undefined1 *puStack_a48;
  that_type that_4;
  undefined1 local_9f9;
  undefined1 *puStack_9f8;
  that_type that_14;
  undefined1 local_959;
  undefined1 *puStack_958;
  that_type that_20;
  expr_type that_1;
  expr_type that;
  expr_type that_15;
  undefined1 local_7c9;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_7c8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_7c0;
  undefined1 *local_7b8;
  undefined1 local_7a9;
  terminal<boost::spirit::tag::byte_> *local_7a8;
  undefined1 **local_7a0;
  undefined1 *local_798;
  terminal<boost::spirit::tag::byte_> *local_790;
  undefined1 *local_788;
  phoenix local_77b [3];
  undefined1 *puStack_778;
  expr_type that_2;
  undefined1 local_736;
  empty_env local_735;
  int local_734;
  empty_env d;
  phoenix *ppStack_730;
  empty_state s;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_71a;
  undefined1 local_719;
  data_param local_718;
  state_param local_710;
  phoenix *local_708;
  undefined1 *local_700;
  expr_param local_6f8;
  undefined1 *local_6f0;
  expr_type local_6e3;
  undefined1 local_6e1;
  expr_param pbStack_6e0;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_3;
  undefined1 local_6d1;
  proto_child0 local_6d0;
  undefined1 **local_6c8;
  undefined1 *local_6c0;
  proto_child0 local_6b8;
  undefined1 *local_6b0;
  undefined1 local_6a4 [8];
  expr_type that_12;
  undefined1 local_63e;
  empty_env local_63d;
  int local_63c;
  empty_env d_4;
  expr_param pbStack_638;
  empty_state s_4;
  impl<_d761afb8_> local_622;
  undefined1 local_621;
  data_param local_620;
  state_param local_618;
  expr_param local_610;
  undefined1 *local_608;
  expr_param local_600;
  undefined1 *local_5f8;
  expr_param local_5f0;
  undefined1 local_5e0 [8];
  expr_type that_10;
  undefined1 local_56e;
  empty_env local_56d;
  int local_56c;
  empty_env d_3;
  expr_param pbStack_568;
  empty_state s_3;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_3L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_542;
  undefined1 local_541;
  data_param local_540;
  state_param local_538;
  expr_param local_530;
  undefined1 *local_528;
  expr_type local_518;
  expr_type local_510;
  undefined1 *local_508;
  actor<boost::spirit::argument<0>_> *local_500;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_3L>_>_>,_2L>_>
  that_11;
  undefined1 local_4e1;
  basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_4e0;
  expr_type that_6;
  basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>
  local_4a0 [2];
  undefined4 *local_498;
  undefined1 *local_490;
  proto_child0 local_484;
  empty_env local_47d;
  int local_47c;
  empty_env d_2;
  expr_param pbStack_478;
  empty_state s_2;
  undefined1 local_45e;
  empty_env local_45d;
  int local_45c;
  empty_env d_1;
  expr_param pbStack_458;
  empty_state s_1;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_&,_int,_boost::proto::envns_::empty_env>
  local_432;
  undefined1 local_431;
  data_param local_430;
  state_param local_428;
  expr_param local_420;
  undefined1 *local_418;
  proto_child0 local_40c;
  expr_param local_408;
  undefined1 *local_400;
  proto_child0 local_3f4;
  expr_param pbStack_3f0;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>
  that_8;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_3ca [2];
  basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L> that_7;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_9;
  undefined1 local_379;
  proto_child0 local_378;
  undefined1 **local_370;
  undefined1 *local_368;
  proto_child0 local_360;
  undefined1 *local_358;
  proto_child0 local_348;
  expr<_eccd61ae_> *local_340;
  expr<_eccd61ae_> *local_338;
  proto_child0 local_330;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *local_320;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *local_318;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_308;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  *local_300;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>
  *local_2f8;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>
  *local_2f0;
  actor<boost::spirit::attribute<0>_> local_2e1;
  undefined4 **local_2e0;
  proto_child0 local_2d8;
  proto_child0 local_2d0;
  undefined4 **local_2c8;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_2b8;
  that_type that_16;
  undefined1 local_279;
  proto_child0 local_278;
  proto_child0 local_270;
  undefined1 *local_268;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_260;
  undefined4 *local_258;
  undefined4 *local_250;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::push_back>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>_&>,_2L>_&>,_2L>
  that_18;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prStack_238;
  that_type that_17;
  undefined1 local_201;
  proto_child0 local_200;
  proto_child0 local_1f8;
  undefined1 *local_1f0;
  expr<_eccd61ae_> *peStack_1e0;
  expr_type that_23;
  expr_type that_22;
  expr_type that_21;
  expr_type that_19;
  undefined1 local_31;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_30;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_28;
  undefined1 *local_20;
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  **local_18;
  undefined1 *local_10;
  
  local_af0 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,"unnamed-grammar",&local_b11);
  boost::spirit::qi::
  grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->start,&local_b10);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"unnamed-rule",&local_b49)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->start,&local_b48);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b70,"unnamed-rule",&local_b71)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_vec3<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->vector,&local_b70);
  std::__cxx11::string::~string((string *)&local_b70);
  std::allocator<char>::~allocator(&local_b71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b98,"unnamed-rule",&local_b99)
  ;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->endSolid,&local_b98);
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator(&local_b99);
  local_ab0 = &boost::spirit::little_bin_float;
  local_ab8 = &boost::spirit::little_bin_float;
  local_bc0.child0 = (proto_child0)&boost::spirit::little_bin_float;
  local_bc0.child1 = (proto_child1)&boost::spirit::little_bin_float;
  local_bb0.child0 = &local_bc0;
  local_ae0 = &boost::spirit::little_bin_float;
  local_bb0.child1 = (proto_child1)&boost::spirit::little_bin_float;
  local_ad8 = local_bb0.child0;
  local_ad0 = local_bb0.child0;
  local_ac8 = local_bb0.child1;
  local_aa8 = local_bc0.child0;
  local_aa0 = local_bc0.child1;
  boost::spirit::qi::operator%=(&this->vector,&local_bb0);
  local_bfc = 0x50;
  ppVar3 = (phoenix *)&boost::spirit::repeat;
  boost::spirit::terminal<boost::spirit::tag::repeat>::operator()
            (local_bf8,(int *)&boost::spirit::repeat,(is_false)&local_bfc);
  boost::phoenix::at_c<0,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple);
  puStack_778 = &boost::spirit::_1;
  ppVar3 = local_77b;
  local_734 = 0;
  local_700 = &local_736;
  local_710 = &local_734;
  local_718 = &local_735;
  ppStack_730 = ppVar3;
  local_708 = ppVar3;
  local_6f8 = boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_71a,(expr_param)ppVar3,local_710,local_718);
  local_6f0 = &local_719;
  local_6e3 = (local_6f8->child0).proto_expr_;
  local_6e1 = local_6f8->field_0x2;
  local_c10.child1 = (proto_child1)local_c13;
  puStack_a48 = &boost::spirit::byte_;
  local_788 = &local_7a9;
  local_798 = (undefined1 *)((long)&that_5.child1 + 7);
  local_7a0 = &puStack_a48;
  local_c10.child0 = (proto_child0)&boost::spirit::byte_;
  paVar2 = (actor<boost::spirit::argument<0>_> *)local_bf8;
  local_bf0.child1 = &local_c10;
  local_7b8 = &local_7c9;
  local_bf0.child0 = (proto_child0)paVar2;
  local_a70 = local_bf0.child1;
  local_a68 = paVar2;
  local_a60 = paVar2;
  that_4.child1 = local_c10.child1;
  local_7c8 = local_bf0.child1;
  local_7c0 = local_bf0.child1;
  local_7a8 = (terminal<boost::spirit::tag::byte_> *)local_c10.child1;
  local_790 = (terminal<boost::spirit::tag::byte_> *)local_c10.child1;
  pbStack_6e0 = local_6f8;
  that_4.child0 = (proto_child0)local_c10.child1;
  boost::phoenix::at_c<1,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple_00);
  ppVar3 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  reserve<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<1>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            (local_c5a,(adl_barrier *)&boost::spirit::_1,a0,paVar2);
  boost::phoenix::at_c<2,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple_01);
  local_c7c = 3;
  local_498 = &local_c7c;
  that_6 = (expr_type)&boost::spirit::_1;
  local_490 = &local_4e1;
  local_4a0[0].child0 = 3;
  pbStack_458 = local_4a0;
  local_45c = 0;
  local_418 = &local_45e;
  local_428 = &local_45c;
  local_430 = &local_45d;
  local_420 = pbStack_458;
  local_408 = boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_432,pbStack_458,local_428,local_430);
  local_400 = &local_431;
  local_4e0.child0.proto_expr_.child0 = (expr_type)local_408->child0;
  pbStack_478 = &local_4e0;
  local_47c = 0;
  _that_7 = &local_47d;
  local_484 = (proto_child0)local_4e0.child0.proto_expr_.child0;
  local_40c = (proto_child0)local_4e0.child0.proto_expr_.child0;
  local_3f4 = (proto_child0)local_4e0.child0.proto_expr_.child0;
  pbStack_3f0 = local_408;
  pbVar1 = boost::proto::_::
           impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
           ::operator()(local_3ca,pbStack_478,&local_47c,_that_7);
  local_c78[0] = (pbVar1->child0).proto_expr_.child0;
  local_c6e._2_8_ =
       boost::phoenix::adl_barrier::
       reserve<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<2>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>>
                 ((type *)local_c6e,(adl_barrier *)local_c78,a0_00,
                  (actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
                   *)(ulong)local_c78[0]);
  that_10.child1.proto_expr_.child2.proto_expr_ = (expr_type)((long)local_c6e + 2);
  e = (expr_param)local_5e0;
  local_56c = 0;
  local_528 = &local_56e;
  local_538 = &local_56c;
  local_540 = &local_56d;
  unique0x10000d36 = (type *)local_c6e._2_8_;
  pbStack_568 = e;
  local_530 = e;
  local_510 = (expr_type)
              boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::comma,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<1>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_3L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list3<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::reserve>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<2>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::multiplies,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_>,_3L>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_542,e,local_538,local_540);
  local_508 = &local_541;
  paVar2 = *(actor<boost::spirit::argument<0>_> **)local_510;
  that_11.proto_expr_._0_8_ = ((proto_child2 *)((long)local_510 + 8))->proto_expr_;
  local_518 = that_11.proto_expr_.child0.proto_expr_;
  local_c4c = that_11.proto_expr_.child0.proto_expr_;
  local_500 = paVar2;
  that_11.proto_expr_.child1.proto_expr_.child2.proto_expr_ = local_510;
  boost::phoenix::at_c<3,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,(phoenix *)e,tuple_02);
  boost::phoenix::adl_barrier::
  reserve<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<3>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)(local_c90 + 0xe),(adl_barrier *)&boost::spirit::_1,a0_01,paVar2);
  that_12._12_8_ = local_c80;
  that_12.child0.proto_expr_.child0.proto_expr_ = local_c4c;
  e_00 = (expr_param)local_6a4;
  local_63c = 0;
  local_608 = &local_63e;
  local_618 = &local_63c;
  local_620 = &local_63d;
  pbStack_638 = e_00;
  local_610 = e_00;
  local_600 = boost::proto::_::impl<$d761afb8$>::operator()(&local_622,e_00,local_618,local_620);
  local_5f8 = &local_621;
  local_c44._0_4_ = (local_600->child0).proto_expr_.child0;
  local_c44._4_1_ = (local_600->child0).proto_expr_.child1.proto_expr_.field_0x0;
  local_c44._5_2_ = (local_600->child0).proto_expr_.child1.proto_expr_.child1;
  local_c44._7_1_ = (local_600->child0).proto_expr_.child1.proto_expr_.field_0x3;
  that_13.proto_expr_.child0.proto_expr_._0_8_ =
       (local_600->child0).proto_expr_.child1.proto_expr_.child2.proto_expr_;
  that_13.proto_expr_.child0.proto_expr_.child1.proto_expr_.child2.proto_expr_.child0.proto_expr_.
  child0 = *(expr_type *)&(local_600->child1).proto_expr_;
  that_14.child1 = (proto_child1)&local_c44;
  puStack_9f8 = &boost::spirit::little_dword;
  local_6b0 = &local_6d1;
  local_6c0 = &local_9f9;
  local_6c8 = &puStack_9f8;
  that_13.proto_expr_._12_8_ = &boost::spirit::little_dword;
  local_be0.child0 = &local_bf0;
  paVar2 = (actor<boost::spirit::argument<0>_> *)
           &that_13.proto_expr_.child0.proto_expr_.child1.proto_expr_.child2.proto_expr_.field_0x4;
  local_be0.child1 = (proto_child1)paVar2;
  local_a90 = paVar2;
  local_a88 = local_be0.child0;
  local_a80 = local_be0.child0;
  local_a78 = paVar2;
  local_6d0 = (proto_child0)that_14.child1;
  local_6b8 = (proto_child0)that_14.child1;
  local_5f0 = local_600;
  that_14.child0 = (proto_child0)that_14.child1;
  boost::phoenix::at_c<1,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,(phoenix *)e_00,
             (actor<boost::spirit::attribute<0>_> *)local_be0.child0);
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<1>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_cc6,(adl_barrier *)&boost::spirit::_1,a0_02,paVar2);
  local_cb8 = (proto_child0)(local_cc6 + 2);
  local_268 = &local_279;
  local_cec = 3;
  ppVar3 = (phoenix *)&boost::spirit::repeat;
  paVar2 = (actor<boost::spirit::argument<0>_> *)0x0;
  local_cc0 = &this->vector;
  prStack_2b8 = &this->vector;
  that_16.child0 = local_cb8;
  that_16.child1 = (proto_child1)local_cb8;
  local_278 = local_cb8;
  local_270 = local_cb8;
  boost::spirit::terminal<boost::spirit::tag::repeat>::operator()
            (local_ce8,(int *)&boost::spirit::repeat,(is_false)&local_cec);
  boost::phoenix::at_c<2,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,tuple_03);
  ppVar3 = (phoenix *)&boost::spirit::_1;
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<2>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)local_d06,(adl_barrier *)&boost::spirit::_1,a0_03,paVar2);
  local_cf8 = (proto_child0)(local_d06 + 2);
  local_1f0 = &local_201;
  local_10 = (undefined1 *)((long)&that_18.child1 + 7);
  local_18 = &prStack_238;
  local_ce0 = (undefined4 *)local_ce8;
  local_cd8 = &local_d00;
  local_20 = &local_31;
  a1 = (proto_child0)&local_cc0;
  local_ca8 = &local_ce0;
  local_d00 = &this->vector;
  local_cb0 = a1;
  local_2e0 = local_ca8;
  local_2d8 = a1;
  local_2d0 = a1;
  local_2c8 = local_ca8;
  local_260 = local_cd8;
  local_258 = local_ce0;
  local_250 = local_ce0;
  prStack_238 = &this->vector;
  that_17.child0 = local_cf8;
  that_17.child1 = (proto_child1)local_cf8;
  local_200 = local_cf8;
  local_1f8 = local_cf8;
  local_30 = local_cd8;
  local_28 = local_cd8;
  boost::phoenix::at_c<3,boost::phoenix::actor<boost::spirit::attribute<0>>>
            ((type *)&boost::spirit::_val,ppVar3,&local_2e1);
  boost::phoenix::adl_barrier::
  push_back<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<mpl_::int_<3>>,0l>,boost::phoenix::actor<boost::spirit::attribute<0>>>,2l>>,boost::phoenix::actor<boost::spirit::argument<0>>>
            ((type *)&local_d26,(adl_barrier *)&boost::spirit::_1,a0_04,
             (actor<boost::spirit::argument<0>_> *)a1);
  local_d20.child1 = (proto_child1)((long)&local_d26 + 2);
  puStack_958 = &boost::spirit::little_word;
  local_358 = &local_379;
  local_368 = &local_959;
  local_370 = &puStack_958;
  local_d20.child0 = (proto_child0)&boost::spirit::little_word;
  local_ca0.child0 = (proto_child0)&local_cb0;
  local_ca0.child1 = &local_d20;
  local_c90._0_8_ = &local_ca0;
  local_bd0.child0 = &local_be0;
  local_bd0.child1 = (proto_child1)local_c90;
  that_20.child1 = (proto_child1)local_d20.child1;
  local_378 = (proto_child0)local_d20.child1;
  local_360 = (proto_child0)local_d20.child1;
  local_348 = (proto_child0)local_bd0.child1;
  local_340 = local_bd0.child0;
  local_338 = local_bd0.child0;
  local_330 = (proto_child0)local_bd0.child1;
  local_320 = (expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
               *)local_c90._0_8_;
  local_318 = (expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::repeat,_boost::fusion::vector<int>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::byte_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::plus_assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::tag::at_c,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<mpl_::int_<0>_>,_0L>,_boost::phoenix::actor<boost::spirit::attribute<0>_>_>,_2L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
               *)local_c90._0_8_;
  local_308 = local_ca0.child1;
  local_300 = local_ca0.child0;
  local_2f8 = local_ca0.child0;
  local_2f0 = local_ca0.child1;
  peStack_1e0 = local_bd0.child0;
  that_23.child0 = (proto_child0)local_bd0.child1;
  that_23.child1 = local_bd0.child1;
  that_20.child0 = (proto_child0)local_d20.child1;
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tyti::stl::basic_solid<double>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::operator=<_3dafb464_>(&this->start,&local_bd0);
  return;
}

Assistant:

stl_parser_binary() : stl_parser_binary::base_type(start)
            {
                namespace spirit = boost::spirit;
                namespace qi = boost::spirit::qi;
                namespace ql = qi::labels;
                namespace ascii = boost::spirit::ascii;
                namespace px = boost::phoenix;

                vector %= spirit::little_bin_float >> spirit::little_bin_float >> spirit::little_bin_float;

                start =
                    qi::repeat(80)[spirit::byte_[px::at_c<0>(ql::_val) += ql::_1]]              //80x8-bit header
                    >> spirit::little_dword[px::reserve(px::at_c<1>(ql::_val), ql::_1),
                    px::reserve(px::at_c<2>(ql::_val), 3 * ql::_1),
                    px::reserve(px::at_c<3>(ql::_val), ql::_1)]    //# of triangles
                    >> *(vector[px::push_back(px::at_c<1>(ql::_val), ql::_1)]  //normal
                        >> spirit::repeat(3)[vector[px::push_back(px::at_c<2>(ql::_val), ql::_1)]] //vertices
                        >> spirit::little_word[px::push_back(px::at_c<3>(ql::_val), ql::_1)]  //attribute
                        )
                    //end
                    ;
            }